

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void AArch64_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  int iVar6;
  arm64_reg aVar7;
  cs_ac_type cVar8;
  int iVar9;
  MCOperand *pMVar10;
  MCOperand *pMVar11;
  MCOperand *pMVar12;
  MCOperand *op;
  int64_t iVar13;
  int64_t iVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  SStream *in_RSI;
  MCInst *in_RDI;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  uint8_t access_5;
  uint8_t access_4;
  int BitWidth;
  int ImmS;
  int ImmR;
  MCOperand *Op2_1;
  MCOperand *Op0_1;
  uint8_t access_3;
  uint8_t access_2;
  uint8_t access_1;
  int imms;
  int immr;
  int shift;
  char *AsmMnemonic_1;
  uint8_t access;
  char *AsmMnemonic;
  _Bool Is64Bit;
  _Bool IsSigned;
  MCOperand *Op3;
  MCOperand *Op2;
  MCOperand *Op1;
  MCOperand *Op0;
  char *mnem;
  int Width;
  int LSB;
  uint Opcode;
  void *in_stack_00001a98;
  SStream *in_stack_00001aa0;
  MCInst *in_stack_00001aa8;
  undefined4 in_stack_fffffffffffffda8;
  int32_t in_stack_fffffffffffffdac;
  SStream *in_stack_fffffffffffffdb0;
  cs_struct *in_stack_fffffffffffffdb8;
  cs_struct *h;
  MCRegisterInfo *in_stack_fffffffffffffdf0;
  SStream *in_stack_fffffffffffffdf8;
  MCInst *in_stack_fffffffffffffe00;
  MCInst *inst;
  SStream *in_stack_fffffffffffffe88;
  MCInst *in_stack_fffffffffffffe90;
  int local_74;
  char *local_70;
  char *local_60;
  
  uVar4 = MCInst_getOpcode(in_RDI);
  if ((uVar4 != 0x7c4) ||
     (_Var3 = printSysAlias(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88), !_Var3)) {
    if ((uVar4 == 0x503) || (((uVar4 == 0x502 || (uVar4 == 0x821)) || (uVar4 == 0x820)))) {
      pMVar10 = MCInst_getOperand(in_RDI,0);
      pMVar11 = MCInst_getOperand(in_RDI,1);
      pMVar12 = MCInst_getOperand(in_RDI,2);
      op = MCInst_getOperand(in_RDI,3);
      bVar18 = uVar4 == 0x503;
      bVar19 = uVar4 == 0x502;
      bVar20 = uVar4 == 0x503;
      bVar21 = uVar4 == 0x821;
      _Var3 = MCOperand_isImm(pMVar12);
      if (((_Var3) && (iVar13 = MCOperand_getImm(pMVar12), iVar13 == 0)) &&
         (_Var3 = MCOperand_isImm(op), _Var3)) {
        local_60 = (char *)0x0;
        iVar13 = MCOperand_getImm(op);
        if (iVar13 == 7) {
          if (bVar18 || bVar19) {
            local_60 = "sxtb";
          }
          else if (!bVar20 && !bVar21) {
            local_60 = "uxtb";
          }
        }
        else if (iVar13 == 0xf) {
          if (bVar18 || bVar19) {
            local_60 = "sxth";
          }
          else if (!bVar20 && !bVar21) {
            local_60 = "uxth";
          }
        }
        else if (((iVar13 == 0x1f) && (bVar20 || bVar21)) && (bVar18 || bVar19)) {
          local_60 = "sxtw";
        }
        if (local_60 != (char *)0x0) {
          uVar4 = MCOperand_getReg(pMVar10);
          pcVar15 = getRegisterName(uVar4,0);
          uVar4 = MCOperand_getReg(pMVar11);
          uVar4 = getWRegFromXReg(uVar4);
          pcVar16 = getRegisterName(uVar4,0);
          SStream_concat(in_RSI,"%s\t%s, %s",local_60,pcVar15,pcVar16);
          if (in_RDI->csh->detail != CS_OPT_OFF) {
            MCInst_getOpcode(in_RDI);
            cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                  (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                  (uint)in_stack_fffffffffffffdb0);
            in_RDI->flat_insn->detail->groups
            [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] =
                 (uint8_t)cVar8;
            in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
            puVar1 = in_RDI->flat_insn->detail->groups +
                     (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            uVar4 = MCOperand_getReg(pMVar10);
            *(uint *)(in_RDI->flat_insn->detail->groups +
                     (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
                 uVar4;
            pcVar2 = in_RDI->flat_insn->detail;
            (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
            MCInst_getOpcode(in_RDI);
            cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                  (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                  (uint)in_stack_fffffffffffffdb0);
            in_RDI->flat_insn->detail->groups
            [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] =
                 (uint8_t)cVar8;
            in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
            puVar1 = in_RDI->flat_insn->detail->groups +
                     (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            uVar4 = MCOperand_getReg(pMVar11);
            uVar4 = getWRegFromXReg(uVar4);
            *(uint *)(in_RDI->flat_insn->detail->groups +
                     (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
                 uVar4;
            pcVar2 = in_RDI->flat_insn->detail;
            (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          }
          aVar7 = AArch64_map_insn(in_stack_fffffffffffffdb0->buffer);
          MCInst_setOpcodePub(in_RDI,aVar7);
          return;
        }
      }
      _Var3 = MCOperand_isImm(pMVar12);
      if ((_Var3) && (_Var3 = MCOperand_isImm(op), _Var3)) {
        local_70 = (char *)0x0;
        local_74 = 0;
        iVar13 = MCOperand_getImm(pMVar12);
        iVar5 = (int)iVar13;
        iVar13 = MCOperand_getImm(op);
        iVar6 = (int)iVar13;
        if ((uVar4 == 0x820) && ((iVar6 != 0x1f && (iVar6 + 1 == iVar5)))) {
          local_70 = "lsl";
          local_74 = 0x1f - iVar6;
        }
        else if ((uVar4 == 0x821) && ((iVar6 != 0x3f && (iVar6 + 1 == iVar5)))) {
          local_70 = "lsl";
          local_74 = 0x3f - iVar6;
        }
        else if ((uVar4 == 0x820) && (iVar6 == 0x1f)) {
          local_70 = "lsr";
          local_74 = iVar5;
        }
        else if ((uVar4 == 0x821) && (iVar6 == 0x3f)) {
          local_70 = "lsr";
          local_74 = iVar5;
        }
        else if ((uVar4 == 0x502) && (iVar6 == 0x1f)) {
          local_70 = "asr";
          local_74 = iVar5;
        }
        else if ((uVar4 == 0x503) && (iVar6 == 0x3f)) {
          local_70 = "asr";
          local_74 = iVar5;
        }
        if (local_70 != (char *)0x0) {
          uVar4 = MCOperand_getReg(pMVar10);
          pcVar15 = getRegisterName(uVar4,0);
          uVar4 = MCOperand_getReg(pMVar11);
          pcVar16 = getRegisterName(uVar4,0);
          SStream_concat(in_RSI,"%s\t%s, %s, ",local_70,pcVar15,pcVar16);
          printInt32Bang(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
          aVar7 = AArch64_map_insn(in_stack_fffffffffffffdb0->buffer);
          MCInst_setOpcodePub(in_RDI,aVar7);
          if (in_RDI->csh->detail == CS_OPT_OFF) {
            return;
          }
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar10);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar11);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
               (long)local_74;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          return;
        }
      }
      iVar13 = MCOperand_getImm(pMVar12);
      iVar14 = MCOperand_getImm(op);
      if (iVar14 < iVar13) {
        pcVar15 = "ubfiz";
        if (bVar18 || bVar19) {
          pcVar15 = "sbfiz";
        }
        uVar4 = MCOperand_getReg(pMVar10);
        pcVar16 = getRegisterName(uVar4,0);
        uVar4 = MCOperand_getReg(pMVar11);
        pcVar17 = getRegisterName(uVar4,0);
        SStream_concat(in_RSI,"%s\t%s, %s, ",pcVar15,pcVar16,pcVar17);
        MCOperand_getImm(pMVar12);
        printInt32Bang(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        SStream_concat0(in_stack_fffffffffffffdb0,
                        (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        MCOperand_getImm(op);
        printInt32Bang(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        aVar7 = AArch64_map_insn(in_stack_fffffffffffffdb0->buffer);
        MCInst_setOpcodePub(in_RDI,aVar7);
        if (in_RDI->csh->detail != CS_OPT_OFF) {
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar10);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar11);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar5 = 0x20;
          if (bVar20 || bVar21) {
            iVar5 = 0x40;
          }
          iVar13 = MCOperand_getImm(pMVar12);
          *(long *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
               (long)(iVar5 - (int)iVar13);
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar13 = MCOperand_getImm(op);
          *(int64_t *)
           (in_RDI->flat_insn->detail->groups +
           (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = iVar13 + 1;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
        }
      }
      else {
        pcVar15 = "ubfx";
        if (bVar18 || bVar19) {
          pcVar15 = "sbfx";
        }
        uVar4 = MCOperand_getReg(pMVar10);
        pcVar16 = getRegisterName(uVar4,0);
        uVar4 = MCOperand_getReg(pMVar11);
        pcVar17 = getRegisterName(uVar4,0);
        SStream_concat(in_RSI,"%s\t%s, %s, ",pcVar15,pcVar16,pcVar17);
        MCOperand_getImm(pMVar12);
        printInt32Bang(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        SStream_concat0(in_stack_fffffffffffffdb0,
                        (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        MCOperand_getImm(op);
        MCOperand_getImm(pMVar12);
        printInt32Bang(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        inst = in_RDI;
        aVar7 = AArch64_map_insn(in_stack_fffffffffffffdb0->buffer);
        MCInst_setOpcodePub(inst,aVar7);
        if (in_RDI->csh->detail != CS_OPT_OFF) {
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar10);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar11);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar13 = MCOperand_getImm(pMVar12);
          *(int64_t *)
           (in_RDI->flat_insn->detail->groups +
           (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = iVar13;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar13 = MCOperand_getImm(op);
          iVar14 = MCOperand_getImm(pMVar12);
          *(int64_t *)
           (in_RDI->flat_insn->detail->groups +
           (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
               (iVar13 - iVar14) + 1;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
        }
      }
    }
    else if ((uVar4 == 0x69) || (uVar4 == 0x68)) {
      pMVar10 = MCInst_getOperand(in_RDI,0);
      pMVar11 = MCInst_getOperand(in_RDI,2);
      pMVar12 = MCInst_getOperand(in_RDI,3);
      iVar13 = MCOperand_getImm(pMVar12);
      iVar5 = (int)iVar13;
      pMVar12 = MCInst_getOperand(in_RDI,4);
      iVar13 = MCOperand_getImm(pMVar12);
      iVar6 = (int)iVar13;
      if (iVar6 < iVar5) {
        iVar9 = 0x20;
        if (uVar4 == 0x69) {
          iVar9 = 0x40;
        }
        uVar4 = MCOperand_getReg(pMVar10);
        pcVar15 = getRegisterName(uVar4,0);
        uVar4 = MCOperand_getReg(pMVar11);
        pcVar16 = getRegisterName(uVar4,0);
        SStream_concat(in_RSI,"bfi\t%s, %s, ",pcVar15,pcVar16);
        printInt32Bang(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        SStream_concat0(in_stack_fffffffffffffdb0,
                        (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        printInt32Bang(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        aVar7 = AArch64_map_insn(in_stack_fffffffffffffdb0->buffer);
        MCInst_setOpcodePub(in_RDI,aVar7);
        if (in_RDI->csh->detail != CS_OPT_OFF) {
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar10);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar11);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
               (long)((iVar9 - iVar5) % iVar9);
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(in_stack_fffffffffffffdb8,
                                (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
               (long)(iVar6 + 1);
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
        }
      }
      else {
        uVar4 = MCOperand_getReg(pMVar10);
        pcVar15 = getRegisterName(uVar4,0);
        uVar4 = MCOperand_getReg(pMVar11);
        pcVar16 = getRegisterName(uVar4,0);
        SStream_concat(in_RSI,"bfxil\t%s, %s, ",pcVar15,pcVar16);
        printInt32Bang(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        SStream_concat0(in_stack_fffffffffffffdb0,
                        (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        printInt32Bang(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        aVar7 = AArch64_map_insn(in_stack_fffffffffffffdb0->buffer);
        MCInst_setOpcodePub(in_RDI,aVar7);
        if (in_RDI->csh->detail != CS_OPT_OFF) {
          h = in_RDI->csh;
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(h,(uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar10);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(h,(uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar11);
          *(uint *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(h,(uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
               (long)iVar5;
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          MCInst_getOpcode(in_RDI);
          cVar8 = get_op_access(h,(uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                                (uint)in_stack_fffffffffffffdb0);
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar8
          ;
          in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
          puVar1 = in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(in_RDI->flat_insn->detail->groups +
                   (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) =
               (long)((iVar6 - iVar5) + 1);
          pcVar2 = in_RDI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
        }
      }
    }
    else {
      pcVar15 = printAliasInstr(in_stack_00001aa8,in_stack_00001aa0,in_stack_00001a98);
      if (pcVar15 == (char *)0x0) {
        printInstruction(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffdf0);
      }
      else {
        aVar7 = AArch64_map_insn((char *)in_RDI);
        MCInst_setOpcodePub(in_RDI,aVar7);
        (*cs_mem_free)(pcVar15);
      }
    }
  }
  return;
}

Assistant:

void AArch64_printInst(MCInst *MI, SStream *O, void *Info)
{
	// Check for special encodings and print the canonical alias instead.
	unsigned Opcode = MCInst_getOpcode(MI);
	int LSB;
	int Width;
	char *mnem;

	if (Opcode == AArch64_SYSxt && printSysAlias(MI, O))
		return;

	// SBFM/UBFM should print to a nicer aliased form if possible.
	if (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri ||
			Opcode == AArch64_UBFMXri || Opcode == AArch64_UBFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0);
		MCOperand *Op1 = MCInst_getOperand(MI, 1);
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		MCOperand *Op3 = MCInst_getOperand(MI, 3);

		bool IsSigned = (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri);
		bool Is64Bit = (Opcode == AArch64_SBFMXri || Opcode == AArch64_UBFMXri);

		if (MCOperand_isImm(Op2) && MCOperand_getImm(Op2) == 0 && MCOperand_isImm(Op3)) {
			const char *AsmMnemonic = NULL;

			switch (MCOperand_getImm(Op3)) {
				default:
					break;
				case 7:
					if (IsSigned)
						AsmMnemonic = "sxtb";
					else if (!Is64Bit)
						AsmMnemonic = "uxtb";
					break;
				case 15:
					if (IsSigned)
						AsmMnemonic = "sxth";
					else if (!Is64Bit)
						AsmMnemonic = "uxth";
					break;
				case 31:
					// *xtw is only valid for signed 64-bit operations.
					if (Is64Bit && IsSigned)
						AsmMnemonic = "sxtw";
					break;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(getWRegFromXReg(MCOperand_getReg(Op1)), AArch64_NoRegAltName));

				if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
					uint8_t access;
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = getWRegFromXReg(MCOperand_getReg(Op1));
					MI->flat_insn->detail->arm64.op_count++;
				}

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				return;
			}
		}

		// All immediate shifts are aliases, implemented using the Bitfield
		// instruction. In all cases the immediate shift amount shift must be in
		// the range 0 to (reg.size -1).
		if (MCOperand_isImm(Op2) && MCOperand_isImm(Op3)) {
			const char *AsmMnemonic = NULL;
			int shift = 0;
			int immr = (int)MCOperand_getImm(Op2);
			int imms = (int)MCOperand_getImm(Op3);

			if (Opcode == AArch64_UBFMWri && imms != 0x1F && ((imms + 1) == immr)) {
				AsmMnemonic = "lsl";
				shift = 31 - imms;
			} else if (Opcode == AArch64_UBFMXri && imms != 0x3f &&
					((imms + 1 == immr))) {
				AsmMnemonic = "lsl";
				shift = 63 - imms;
			} else if (Opcode == AArch64_UBFMWri && imms == 0x1f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_UBFMXri && imms == 0x3f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMWri && imms == 0x1f) {
				AsmMnemonic = "asr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMXri && imms == 0x3f) {
				AsmMnemonic = "asr";
				shift = immr;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s, ", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));

				printInt32Bang(O, shift);

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
					uint8_t access;
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = shift;
					MI->flat_insn->detail->arm64.op_count++;
				}

				return;
			}
		}

		// SBFIZ/UBFIZ aliases
		if (MCOperand_getImm(Op2) > MCOperand_getImm(Op3)) {
			SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfiz" : "ubfiz"),
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
			printInt32Bang(O, (int)((Is64Bit ? 64 : 32) - MCOperand_getImm(Op2)));
			SStream_concat0(O, ", ");
			printInt32Bang(O, (int)MCOperand_getImm(Op3) + 1);

			MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfiz" : "ubfiz"));

			if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (Is64Bit ? 64 : 32) - (int)MCOperand_getImm(Op2);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op3) + 1;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		// Otherwise SBFX/UBFX is the preferred form
		SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfx" : "ubfx"),
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
		printInt32Bang(O, (int)MCOperand_getImm(Op2));
		SStream_concat0(O, ", ");
		printInt32Bang(O, (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1);

		MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfx" : "ubfx"));

		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op2);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op3) - MCOperand_getImm(Op2) + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	if (Opcode == AArch64_BFMXri || Opcode == AArch64_BFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0); // Op1 == Op0
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		int ImmR = (int)MCOperand_getImm(MCInst_getOperand(MI, 3));
		int ImmS = (int)MCOperand_getImm(MCInst_getOperand(MI, 4));

		// BFI alias
		if (ImmS < ImmR) {
			int BitWidth = Opcode == AArch64_BFMXri ? 64 : 32;
			LSB = (BitWidth - ImmR) % BitWidth;
			Width = ImmS + 1;

			SStream_concat(O, "bfi\t%s, %s, ",
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
			printInt32Bang(O, LSB);
			SStream_concat0(O, ", ");
			printInt32Bang(O, Width);
			MCInst_setOpcodePub(MI, AArch64_map_insn("bfi"));

			if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		LSB = ImmR;
		Width = ImmS - ImmR + 1;
		// Otherwise BFXIL the preferred form
		SStream_concat(O, "bfxil\t%s, %s, ",
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
		printInt32Bang(O, LSB);
		SStream_concat0(O, ", ");
		printInt32Bang(O, Width);
		MCInst_setOpcodePub(MI, AArch64_map_insn("bfxil"));

		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		MCInst_setOpcodePub(MI, AArch64_map_insn(mnem));
		cs_mem_free(mnem);
	} else {
		printInstruction(MI, O, Info);
	}
}